

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_common.cpp
# Opt level: O2

void src_SourceOver(uint32_t *dest,int length,uint32_t *src,uint32_t alpha)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = 0;
  if (0 < length) {
    uVar1 = (ulong)(uint)length;
  }
  if (alpha == 0xff) {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      uVar3 = src[uVar2];
      if (uVar3 < 0xff000000) {
        if (uVar3 != 0) {
          dest[uVar2] = ((dest[uVar2] >> 8 & 0xff00ff) * (~uVar3 >> 0x18) & 0xff00ff00) + uVar3 +
                        ((dest[uVar2] & 0xff00ff) * (~uVar3 >> 0x18) >> 8 & 0xff00ff);
        }
      }
      else {
        dest[uVar2] = uVar3;
      }
    }
  }
  else {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      uVar3 = (src[uVar2] >> 8 & 0xff00ff) * alpha;
      uVar4 = ~uVar3 >> 0x18;
      dest[uVar2] = ((dest[uVar2] & 0xff00ff) * uVar4 >> 8 & 0xff00ff) +
                    ((dest[uVar2] >> 8 & 0xff00ff) * uVar4 & 0xff00ff00) +
                    ((src[uVar2] & 0xff00ff) * alpha >> 8 & 0xff00ff | uVar3 & 0xff00ff00);
    }
  }
  return;
}

Assistant:

static void src_SourceOver(uint32_t *dest, int length, const uint32_t *src,
                           uint32_t alpha)
{
    uint32_t s, sia;

    if (alpha == 255) {
        for (int i = 0; i < length; ++i) {
            s = src[i];
            if (s >= 0xff000000)
                dest[i] = s;
            else if (s != 0) {
                sia = vAlpha(~s);
                dest[i] = s + BYTE_MUL(dest[i], sia);
            }
        }
    } else {
        /* source' = source * const_alpha
         * dest = source' + dest ( 1- source'a)
         */
        for (int i = 0; i < length; ++i) {
            s = BYTE_MUL(src[i], alpha);
            sia = vAlpha(~s);
            dest[i] = s + BYTE_MUL(dest[i], sia);
        }
    }
}